

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O3

void soplex::
     initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecset,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *facset,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *veclogs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *vecnnzinv,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  Item *pIVar1;
  byte bVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  fpclass_type fVar6;
  fpclass_type fVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  int32_t iVar10;
  pointer pnVar9;
  int32_t iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this;
  long lVar15;
  long lVar16;
  long lVar17;
  uint *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  cpp_dec_float<200u,int,void> *pcVar20;
  undefined4 *puVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  uint *puVar23;
  uint *puVar24;
  pointer pnVar25;
  long lVar26;
  byte bVar27;
  double dVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nnzinv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  logsum;
  int local_534;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [13];
  undefined3 uStack_47b;
  int iStack_478;
  bool bStack_474;
  undefined8 local_470;
  cpp_dec_float<200U,_int,_void> local_468;
  cpp_dec_float<200U,_int,_void> local_3e8;
  cpp_dec_float<200U,_int,_void> local_360;
  cpp_dec_float<200U,_int,_void> local_2e0;
  uint local_260 [28];
  uint local_1f0 [28];
  undefined4 local_180 [28];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar27 = 0;
  lVar14 = (long)(vecset->set).thenum;
  if (0 < lVar14) {
    lVar26 = 0;
    do {
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 0x1c;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems[6] = 0;
      local_3e8.data._M_elems[7] = 0;
      local_3e8.data._M_elems[8] = 0;
      local_3e8.data._M_elems[9] = 0;
      local_3e8.data._M_elems[10] = 0;
      local_3e8.data._M_elems[0xb] = 0;
      local_3e8.data._M_elems[0xc] = 0;
      local_3e8.data._M_elems[0xd] = 0;
      local_3e8.data._M_elems[0xe] = 0;
      local_3e8.data._M_elems[0xf] = 0;
      local_3e8.data._M_elems[0x10] = 0;
      local_3e8.data._M_elems[0x11] = 0;
      local_3e8.data._M_elems[0x12] = 0;
      local_3e8.data._M_elems[0x13] = 0;
      local_3e8.data._M_elems[0x14] = 0;
      local_3e8.data._M_elems[0x15] = 0;
      local_3e8.data._M_elems[0x16] = 0;
      local_3e8.data._M_elems[0x17] = 0;
      local_3e8.data._M_elems[0x18] = 0;
      local_3e8.data._M_elems[0x19] = 0;
      local_3e8.data._M_elems._104_5_ = 0;
      local_3e8.data._M_elems[0x1b]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_3e8,0.0);
      pIVar1 = (vecset->set).theitem + (vecset->set).thekey[lVar26].idx;
      iVar13 = (pIVar1->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      lVar16 = (long)iVar13;
      if (lVar16 < 1) {
        local_534 = 0;
LAB_00149e3b:
        local_470._0_4_ = cpp_dec_float_finite;
        local_470._4_4_ = 0x1c;
        bStack_474 = false;
        iStack_478 = 0;
        uStack_47b = 0;
        local_488 = SUB1613((undefined1  [16])0x0,0);
        local_498 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4c8 = (undefined1  [16])0x0;
        local_4e8._16_16_ = (undefined1  [16])0x0;
        local_4e8._0_16_ = (undefined1  [16])0x0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3e8,1.0);
        dVar28 = 1.0;
      }
      else {
        lVar17 = 0;
        local_534 = 0;
        do {
          pNVar8 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar23 = (uint *)((long)&(pNVar8->val).m_backend.data + lVar17);
          puVar18 = puVar23;
          puVar24 = local_260;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar24 = *puVar18;
            puVar18 = puVar18 + (ulong)bVar27 * -2 + 1;
            puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
          }
          iVar3 = *(int *)((long)&(pNVar8->val).m_backend.data + lVar17 + 0x70);
          bVar2 = *(byte *)((long)&(pNVar8->val).m_backend.data + lVar17 + 0x74);
          fVar4 = *(fpclass_type *)((long)&(pNVar8->val).m_backend.data + lVar17 + 0x78);
          iVar5 = *(int32_t *)((long)&(pNVar8->val).m_backend.data + lVar17 + 0x7c);
          puVar18 = local_a0;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar18 = *puVar23;
            puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar27 * -2 + 1;
          }
          pnVar22 = epsilon;
          pcVar19 = &local_2e0;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar19->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + ((ulong)bVar27 * -2 + 1) * 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar19 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_2e0.exp = (epsilon->m_backend).exp;
          local_2e0.neg = (epsilon->m_backend).neg;
          fVar6 = (epsilon->m_backend).fpclass;
          iVar10 = (epsilon->m_backend).prec_elem;
          local_2e0.fpclass = fVar6;
          local_2e0.prec_elem = iVar10;
          puVar23 = local_a0;
          pcVar19 = &local_468;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar19->data)._M_elems[0] = *puVar23;
            puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
          }
          local_468.exp = iVar3;
          local_468.neg = (bool)bVar2;
          local_468.prec_elem = iVar5;
          local_468.fpclass = fVar4;
          if ((bVar2 == 1) && (local_468.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
            local_468.neg = false;
          }
          if ((fVar6 == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) ||
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_468,&local_2e0), 0 < iVar12)) {
            puVar23 = local_260;
            puVar18 = (uint *)local_4e8;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar18 = *puVar23;
              puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
              puVar18 = puVar18 + (ulong)bVar27 * -2 + 1;
            }
            local_470._4_4_ = iVar5;
            local_470._0_4_ = fVar4;
            bStack_474 = (bool)bVar2;
            if ((bVar2 != 0) && (fVar4 != cpp_dec_float_finite || local_4e8._0_4_ != 0)) {
              bStack_474 = (bool)(bVar2 ^ 1);
            }
            iStack_478 = iVar3;
            dVar28 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                               ((cpp_dec_float<200U,_int,_void> *)local_4e8);
            dVar28 = log2(dVar28);
            local_468.fpclass = cpp_dec_float_finite;
            local_468.prec_elem = 0x1c;
            local_468.data._M_elems[0] = 0;
            local_468.data._M_elems[1] = 0;
            local_468.data._M_elems[2] = 0;
            local_468.data._M_elems[3] = 0;
            local_468.data._M_elems[4] = 0;
            local_468.data._M_elems[5] = 0;
            local_468.data._M_elems[6] = 0;
            local_468.data._M_elems[7] = 0;
            local_468.data._M_elems[8] = 0;
            local_468.data._M_elems[9] = 0;
            local_468.data._M_elems[10] = 0;
            local_468.data._M_elems[0xb] = 0;
            local_468.data._M_elems[0xc] = 0;
            local_468.data._M_elems[0xd] = 0;
            local_468.data._M_elems[0xe] = 0;
            local_468.data._M_elems[0xf] = 0;
            local_468.data._M_elems[0x10] = 0;
            local_468.data._M_elems[0x11] = 0;
            local_468.data._M_elems[0x12] = 0;
            local_468.data._M_elems[0x13] = 0;
            local_468.data._M_elems[0x14] = 0;
            local_468.data._M_elems[0x15] = 0;
            local_468.data._M_elems[0x16] = 0;
            local_468.data._M_elems[0x17] = 0;
            local_468.data._M_elems[0x18] = 0;
            local_468.data._M_elems[0x19] = 0;
            local_468.data._M_elems._104_5_ = 0;
            local_468.data._M_elems[0x1b]._1_3_ = 0;
            local_468.exp = 0;
            local_468.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_468,dVar28);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&local_3e8,&local_468);
            local_534 = local_534 + 1;
          }
          lVar17 = lVar17 + 0x84;
        } while (lVar16 * 0x84 != lVar17);
        local_470._0_4_ = cpp_dec_float_finite;
        local_470._4_4_ = 0x1c;
        local_4e8._0_16_ = (undefined1  [16])0x0;
        local_4e8._16_16_ = (undefined1  [16])0x0;
        local_4c8 = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = SUB1613((undefined1  [16])0x0,0);
        uStack_47b = 0;
        iStack_478 = 0;
        bStack_474 = false;
        if (local_534 < 1) goto LAB_00149e3b;
        dVar28 = 1.0 / (double)local_534;
      }
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_4e8,dVar28);
      pcVar19 = &local_3e8;
      puVar23 = local_110;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar23 = (pcVar19->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
        puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
      }
      iVar3 = (veclogs->super_IdxSet).num;
      (veclogs->super_IdxSet).num = iVar3 + 1;
      pnVar9 = (veclogs->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (veclogs->super_IdxSet).idx[iVar3] = (int)lVar26;
      puVar23 = local_110;
      pnVar25 = pnVar9 + lVar26;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
        pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      pnVar9[lVar26].m_backend.exp = local_3e8.exp;
      pnVar9[lVar26].m_backend.neg = local_3e8.neg;
      pnVar9[lVar26].m_backend.fpclass = local_3e8.fpclass;
      pnVar9[lVar26].m_backend.prec_elem = local_3e8.prec_elem;
      pcVar20 = (cpp_dec_float<200u,int,void> *)local_4e8;
      puVar21 = local_180;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar21 = *(undefined4 *)pcVar20;
        pcVar20 = pcVar20 + (ulong)bVar27 * -8 + 4;
        puVar21 = puVar21 + (ulong)bVar27 * -2 + 1;
      }
      iVar3 = (vecnnzinv->super_IdxSet).num;
      (vecnnzinv->super_IdxSet).num = iVar3 + 1;
      pnVar9 = (vecnnzinv->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (vecnnzinv->super_IdxSet).idx[iVar3] = (int)lVar26;
      puVar21 = local_180;
      pnVar25 = pnVar9 + lVar26;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = *puVar21;
        puVar21 = puVar21 + (ulong)bVar27 * -2 + 1;
        pnVar25 = (pointer)((long)pnVar25 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      pnVar9[lVar26].m_backend.exp = iStack_478;
      pnVar9[lVar26].m_backend.neg = bStack_474;
      pnVar9[lVar26].m_backend.fpclass = (fpclass_type)local_470;
      pnVar9[lVar26].m_backend.prec_elem = local_470._4_4_;
      this = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::create(facset,local_534);
      if (0 < iVar13) {
        lVar17 = 0;
        do {
          pNVar8 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar23 = (uint *)((long)&(pNVar8->val).m_backend.data + lVar17);
          puVar18 = local_1f0;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar18 = *puVar23;
            puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar27 * -2 + 1;
          }
          local_468.exp = *(int *)((long)&(pNVar8->val).m_backend.data + lVar17 + 0x70);
          local_468.neg = *(bool *)((long)&(pNVar8->val).m_backend.data + lVar17 + 0x74);
          local_468._120_8_ = *(undefined8 *)((long)&(pNVar8->val).m_backend.data + lVar17 + 0x78);
          pnVar22 = epsilon;
          pcVar19 = &local_360;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar19->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + ((ulong)bVar27 * -2 + 1) * 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar19 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_360.exp = (epsilon->m_backend).exp;
          local_360.neg = (epsilon->m_backend).neg;
          fVar7 = (epsilon->m_backend).fpclass;
          iVar11 = (epsilon->m_backend).prec_elem;
          local_360.fpclass = fVar7;
          local_360.prec_elem = iVar11;
          puVar23 = local_1f0;
          pcVar19 = &local_468;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar19->data)._M_elems[0] = *puVar23;
            puVar23 = puVar23 + (ulong)bVar27 * -2 + 1;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
          }
          if ((local_468.neg == true) &&
             (local_468.data._M_elems[0] != 0 || local_468.fpclass != cpp_dec_float_finite)) {
            local_468.neg = false;
          }
          if ((fVar7 == cpp_dec_float_NaN || local_468.fpclass == cpp_dec_float_NaN) ||
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_468,&local_360), 0 < iVar13)) {
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(this,*(int *)((long)(&((pIVar1->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar17),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_4e8);
          }
          lVar17 = lVar17 + 0x84;
        } while (lVar16 * 0x84 != lVar17);
      }
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::sort(this);
      lVar26 = lVar26 + 1;
    } while (lVar26 != lVar14);
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}